

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS
          (FixVariablePS *this,SPxLPBase<double> *lp,SPxMainSM<double> *simplifier,int _j,double val
          ,shared_ptr<soplex::Tolerances> *tols,bool correctIdx)

{
  int iVar1;
  SPxSense SVar2;
  double *pdVar3;
  double *pdVar4;
  SPxLPBase<double> *this_00;
  undefined4 in_ECX;
  long *in_RDX;
  SPxLPBase<double> *in_RSI;
  undefined8 *in_RDI;
  byte in_R9B;
  undefined8 in_XMM0_Qa;
  double dVar5;
  SVectorBase<double> *in_stack_ffffffffffffff28;
  SPxLPBase<double> *in_stack_ffffffffffffff30;
  double dVar6;
  undefined8 in_stack_ffffffffffffff38;
  int i;
  SPxLPBase<double> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  PostStep *in_stack_ffffffffffffff50;
  double local_98;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff30,
             (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff28);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x288fa4);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x288fba);
  PostStep::PostStep(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff40,
                     (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38)
  ;
  i = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x288ff4);
  *in_RDI = &PTR__FixVariablePS_00897840;
  *(undefined4 *)(in_RDI + 5) = in_ECX;
  iVar1 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x289023);
  *(int *)((long)in_RDI + 0x2c) = iVar1 + -1;
  in_RDI[6] = in_XMM0_Qa;
  SVar2 = SPxLPBase<double>::spxSense(in_RSI);
  if (SVar2 == MINIMIZE) {
    local_98 = SPxLPBase<double>::obj(in_stack_ffffffffffffff40,i);
  }
  else {
    local_98 = SPxLPBase<double>::obj(in_stack_ffffffffffffff40,i);
    local_98 = -local_98;
  }
  in_RDI[7] = local_98;
  pdVar3 = SPxLPBase<double>::lower
                     (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  in_RDI[8] = *pdVar3;
  pdVar3 = (double *)(in_RDI + 9);
  pdVar4 = SPxLPBase<double>::upper
                     (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  *pdVar3 = *pdVar4;
  *(byte *)(in_RDI + 10) = in_R9B & 1;
  iVar1 = (int)((ulong)(in_RDI + 0xb) >> 0x20);
  this_00 = (SPxLPBase<double> *)
            SPxLPBase<double>::colVector
                      (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  DSVectorBase<double>::DSVectorBase<double>
            ((DSVectorBase<double> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  dVar6 = (double)in_RDI[6];
  dVar5 = SPxLPBase<double>::obj(this_00,iVar1);
  (**(code **)(*in_RDX + 0x88))(dVar6 * dVar5);
  return;
}

Assistant:

FixVariablePS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, const R val,
                    std::shared_ptr<Tolerances> tols, bool correctIdx = true)
         : PostStep("FixVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_val(val)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_correctIdx(correctIdx)
         , m_col(lp.colVector(_j))
      {
         simplifier.addObjoffset(m_val * lp.obj(m_j));
      }